

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::ReplacerImpl<kj::File>::tryCommit
          (ReplacerImpl<kj::File> *this)

{
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *this_00;
  Impl *this_01;
  InMemoryDirectory *pIVar1;
  size_t sVar2;
  File *pFVar3;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> this_02;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  StringPtr name;
  Own<const_kj::File> result;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Own<const_kj::File> local_68;
  Disposer *local_50;
  File *local_48;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *local_40;
  Impl *local_38;
  
  if ((this->super_Replacer<kj::File>).field_0xc == '\x01') {
    (anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::File>::tryCommit();
    bVar6 = true;
  }
  else {
    pIVar1 = (this->directory).ptr;
    this_00 = &pIVar1->impl;
    kj::_::Mutex::lock(&this_00->mutex,EXCLUSIVE);
    this_01 = &(pIVar1->impl).value;
    sVar2 = (this->name).content.size_;
    if (sVar2 == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (this->name).content.ptr;
    }
    name.content.size_ = sVar2 + (sVar2 == 0);
    name.content.ptr = pcVar5;
    local_40 = this_00;
    local_38 = this_01;
    this_02 = InMemoryDirectory::Impl::openEntry(this_01,name,(this->super_Replacer<kj::File>).mode)
    ;
    bVar6 = this_02.ptr != (EntryImpl *)0x0;
    if (bVar6) {
      (*(((this->inner).ptr)->super_ReadableFile).super_FsNode._vptr_FsNode[5])(&local_50);
      local_68.disposer = (Disposer *)0x0;
      local_68.ptr = (File *)0x0;
      if (local_48 != (File *)0x0) {
        local_68.ptr = local_48;
        local_68.disposer = local_50;
        local_48 = (File *)0x0;
      }
      pFVar3 = local_48;
      if (local_48 != (File *)0x0) {
        local_48 = (File *)0x0;
        (**local_50->_vptr_Disposer)
                  (local_50,(pFVar3->super_ReadableFile).super_FsNode._vptr_FsNode[-2] +
                            (long)&(pFVar3->super_ReadableFile).super_FsNode._vptr_FsNode);
      }
      EntryImpl::set(this_02.ptr,&local_68);
      if (local_68.ptr != (File *)0x0) {
        local_68.ptr = (File *)0x0;
        (**(local_68.disposer)->_vptr_Disposer)();
      }
      lVar4 = (*(code *)**(undefined8 **)this_01->clock)();
      (pIVar1->impl).value.lastModified.value.value = lVar4;
    }
    kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE);
  }
  return bVar6;
}

Assistant:

bool tryCommit() override {
      KJ_REQUIRE(!committed, "commit() already called") { return true; }

      auto lock = directory->impl.lockExclusive();
      KJ_IF_MAYBE(entry, lock->openEntry(name, Replacer<T>::mode)) {
        entry->set(inner->clone());
        lock->modified();
        return true;
      } else {
        return false;
      }
    }